

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::RenderCollapseTriangle(ImVec2 p_min,bool is_open,float scale)

{
  ImGuiWindow *pIVar1;
  ImDrawList *this;
  undefined4 uVar2;
  undefined4 uVar3;
  ImGuiContext *pIVar4;
  ImU32 col;
  ImGuiContext *g;
  undefined7 in_register_00000039;
  float fVar5;
  float fVar6;
  float fVar7;
  ImVec2 b;
  ImVec2 a;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  ImVec4 local_28;
  
  pIVar4 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->Accessed = true;
  fVar5 = pIVar4->FontSize * 0.4 * scale;
  fVar6 = pIVar4->FontSize * 0.5;
  fVar7 = fVar6 + p_min.x;
  fVar6 = p_min.y + scale * fVar6;
  if ((int)CONCAT71(in_register_00000039,is_open) == 0) {
    local_38.y = fVar5 * 0.0 + fVar6;
    local_38.x = fVar7 + fVar5;
    fVar7 = fVar5 * -0.5 + fVar7;
    local_40.y = fVar6 + fVar5 * 0.866;
    local_40.x = fVar7;
    fVar6 = fVar6 - fVar5 * 0.866;
  }
  else {
    fVar6 = fVar6 + fVar5 * -0.25;
    local_38.y = fVar5 + fVar6;
    local_38.x = fVar5 * 0.0 + fVar7;
    fVar6 = fVar5 * -0.5 + fVar6;
    local_40.y = fVar6;
    local_40.x = fVar7 - fVar5 * 0.866;
    fVar7 = fVar5 * 0.866 + fVar7;
  }
  local_30.y = fVar6;
  local_30.x = fVar7;
  this = pIVar1->DrawList;
  local_28.x = (pIVar4->Style).Colors[0].x;
  local_28.y = (pIVar4->Style).Colors[0].y;
  uVar2 = (pIVar4->Style).Colors[0].z;
  uVar3 = (pIVar4->Style).Colors[0].w;
  local_28.w = (pIVar4->Style).Alpha * (float)uVar3;
  local_28.z = (float)uVar2;
  col = ColorConvertFloat4ToU32(&local_28);
  ImDrawList::AddTriangleFilled(this,&local_38,&local_40,&local_30,col);
  return;
}

Assistant:

void ImGui::RenderCollapseTriangle(ImVec2 p_min, bool is_open, float scale)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    const float h = g.FontSize * 1.00f;
    const float r = h * 0.40f * scale;
    ImVec2 center = p_min + ImVec2(h*0.50f, h*0.50f*scale);

    ImVec2 a, b, c;
    if (is_open)
    {
        center.y -= r*0.25f;
        a = center + ImVec2(0,1)*r;
        b = center + ImVec2(-0.866f,-0.5f)*r;
        c = center + ImVec2(0.866f,-0.5f)*r;
    }
    else
    {
        a = center + ImVec2(1,0)*r;
        b = center + ImVec2(-0.500f,0.866f)*r;
        c = center + ImVec2(-0.500f,-0.866f)*r;
    }

    window->DrawList->AddTriangleFilled(a, b, c, GetColorU32(ImGuiCol_Text));
}